

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  undefined1 uVar1;
  Descriptor *pDVar2;
  size_t sVar3;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  string_view undefined_symbol;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  DescriptorBuilder *this_00;
  code *pcVar4;
  bool bVar5;
  MaybeInitializedPtr *pMVar6;
  undefined8 *puVar7;
  ulong uVar8;
  once_flag *poVar9;
  reference ppVar10;
  size_type *psVar11;
  Nonnull<char_*> pcVar12;
  EnumDescriptor *pEVar13;
  Symbol SVar14;
  EnumDescriptor *pEVar15;
  EnumValueDescriptor *pEVar16;
  undefined1 *puVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *b;
  undefined8 uVar18;
  char *pcVar19;
  byte bVar20;
  undefined8 *puVar21;
  long lVar22;
  FieldDescriptorProto *descriptor;
  byte bVar23;
  ErrorLocation EVar24;
  PlaceholderType placeholder_type;
  char *pcVar25;
  long lVar26;
  undefined4 uVar27;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view name;
  string_view name_00;
  const_iterator other;
  string_view element_name_02;
  string_view name_01;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view name_02;
  string_view element_name_06;
  iterator iVar28;
  string_view relative_to;
  string_view relative_to_00;
  string_view relative_to_01;
  anon_class_16_2_f7c7e1e7 make_error;
  Symbol extendee;
  btree_set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  fields_used;
  FieldDescriptor *conflicting_field;
  string proposed_message;
  size_type __dnew;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined1 local_1d0 [8];
  undefined1 local_1c8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [2];
  undefined1 *local_168;
  EnumDescriptor *local_160;
  ServiceDescriptor *local_158;
  FieldDescriptorProto *local_150;
  undefined1 local_148 [8];
  undefined1 local_140 [32];
  DescriptorBuilder *local_120;
  undefined1 local_118 [48];
  code *pcStack_e8;
  undefined8 local_e0;
  code *pcStack_d8;
  undefined8 local_d0;
  code *pcStack_c8;
  undefined8 local_c0;
  code *pcStack_b8;
  undefined8 local_b0;
  code *pcStack_a8;
  pointer local_a0;
  code *pcStack_98;
  pointer local_90;
  code *pcStack_88;
  _Alloc_hider local_80;
  size_type sStack_78;
  undefined1 local_70 [16];
  FileDescriptor *local_60;
  code *pcStack_58;
  undefined1 *local_50;
  code *pcStack_48;
  HeapOrSoo local_40;
  
  local_1d0 = (undefined1  [8])field;
  if (((undefined1  [80])((undefined1  [80])proto->field_0 & (undefined1  [80])0x2) !=
       (undefined1  [80])0x0) && ((field->field_0x1 & 8) != 0)) {
    puVar7 = (undefined8 *)
             ((ulong)(proto->field_0)._impl_.extendee_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar19 = (field->all_names_).payload_;
    relative_to._M_len = (ulong)*(ushort *)(pcVar19 + 2);
    relative_to._M_str = pcVar19 + ~relative_to._M_len;
    name._M_str = (char *)*puVar7;
    name._M_len = puVar7[1];
    local_198._M_allocated_capacity =
         (size_type)
         LookupSymbol(this,name,relative_to,PLACEHOLDER_EXTENDABLE_MESSAGE,LOOKUP_ALL,true);
    if (((SymbolBase *)local_198._M_allocated_capacity)->symbol_type_ == '\x01') {
      bVar5 = Symbol::IsVisibleFrom((Symbol *)&local_198._M_allocated_capacity,this->file_);
      if (bVar5) {
        uVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
        if (*(uint8_t *)local_198._M_allocated_capacity == '\x01') {
          uVar18 = local_198._M_allocated_capacity;
        }
        *(undefined8 *)((long)local_1d0 + 0x20) = uVar18;
        if (0 < (long)*(int *)(uVar18 + 0x90)) {
          lVar22 = 0;
          do {
            if ((*(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(uVar18 + 0x60))->_M_allocated_capacity + lVar22) <=
                 *(int *)((long)local_1d0 + 4)) &&
               (*(int *)((long)local_1d0 + 4) <
                *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(uVar18 + 0x60))->_M_allocated_capacity + 4 + lVar22)))
            goto LAB_0022348a;
            lVar22 = lVar22 + 0x28;
          } while ((long)*(int *)(uVar18 + 0x90) * 0x28 != lVar22);
        }
        pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
        element_name_02._M_len = (ulong)*(ushort *)(pcVar19 + 2);
        element_name_02._M_str = pcVar19 + ~element_name_02._M_len;
        local_1c8._0_8_ = local_1d0;
        local_70._0_8_ = local_1c8;
        local_70._8_8_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__2,std::__cxx11::string>
        ;
        make_error_01.invoker_._0_4_ = 0x233258;
        make_error_01.ptr_.obj = (void *)local_70._0_8_;
        make_error_01.invoker_._4_4_ = 0;
        AddError(this,element_name_02,&proto->super_Message,NUMBER,make_error_01);
        goto LAB_0022348a;
      }
      pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
      uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
      pcVar19 = pcVar19 + ~uVar8;
      local_60 = (FileDescriptor *)local_1c8;
      pcStack_58 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__1,std::__cxx11::string>
      ;
      pcVar4 = pcStack_58;
      pcStack_58._0_1_ = true;
      pcStack_58._1_3_ = 0x2332;
      uVar27 = pcStack_58._0_4_;
      local_1c8._0_8_ = &local_198;
      local_1c8._8_8_ = this;
      pcStack_58 = pcVar4;
    }
    else {
      if (((SymbolBase *)local_198._M_allocated_capacity)->symbol_type_ == '\0') {
        pcVar19 = (field->all_names_).payload_;
        uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
        pcVar19 = pcVar19 + ~uVar8;
        pMVar6 = (MaybeInitializedPtr *)
                 ((ulong)(proto->field_0)._impl_.extendee_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
        local_40.heap.slot_array = *pMVar6;
        local_40.heap.control = (ctrl_t *)pMVar6[1];
        uVar27 = SUB84(local_40.heap.control,0);
        uVar29 = SUB84(local_40.heap.control,4);
        uVar30 = local_40._8_4_;
        uVar31 = local_40._12_4_;
        EVar24 = EXTENDEE;
        goto LAB_00223ce4;
      }
      pcVar19 = (field->all_names_).payload_;
      uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
      pcVar19 = pcVar19 + ~uVar8;
      local_50 = local_1c8;
      pcStack_48 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      pcVar4 = pcStack_48;
      pcStack_48._0_1_ = true;
      pcStack_48._1_3_ = 0x2331;
      uVar27 = pcStack_48._0_4_;
      local_1c8._0_8_ = proto;
      pcStack_48 = pcVar4;
    }
    EVar24 = EXTENDEE;
    goto LAB_00223e44;
  }
LAB_0022348a:
  if ((*(undefined1 *)((long)local_1d0 + 1) & 0x10) != 0) {
    if (((anon_union_8_2_2904990b_for_scope_ *)((long)local_1d0 + 0x28))->containing_oneof ==
        (OneofDescriptor *)0x0) {
      internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
    if ((*(undefined1 *)((long)local_1d0 + 1) & 0xc0) != 0x40) {
      pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
      element_name._M_len = (ulong)*(ushort *)(pcVar19 + 2);
      element_name._M_str = pcVar19 + ~element_name._M_len;
      AddError(this,element_name,&proto->super_Message,NAME,
               "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
    }
  }
  if ((*(uint *)&proto->field_0 & 4) == 0) {
    if ((*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint8_t *)((long)local_1d0 + 2) * 4
                  ) | 2) == 10) {
      pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
      uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
      pcVar19 = pcVar19 + ~uVar8;
      pcVar25 = "Field with message or enum type missing type_name.";
LAB_00223508:
      EVar24 = TYPE;
LAB_00223514:
      element_name_00._M_str = pcVar19;
      element_name_00._M_len = uVar8;
      AddError(this,element_name_00,&proto->super_Message,EVar24,pcVar25);
    }
LAB_00223519:
    bVar5 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,(FieldDescriptor *)local_1d0);
    if (bVar5) {
      if ((*(undefined1 *)((long)local_1d0 + 1) & 8) == 0) {
        return;
      }
      bVar5 = DescriptorPool::Tables::AddExtension(this->tables_,(FieldDescriptor *)local_1d0);
      if (bVar5) {
        return;
      }
      local_118._24_8_ = local_1c8;
      local_1c8._8_8_ = local_1d0;
      pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
      element_name_01._M_len = (ulong)*(ushort *)(pcVar19 + 2);
      element_name_01._M_str = pcVar19 + ~element_name_01._M_len;
      local_118._32_8_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__10,std::__cxx11::string>
      ;
      make_error_00.invoker_._0_4_ = 0x23368d;
      make_error_00.ptr_.obj = (void *)local_118._24_8_;
      make_error_00.invoker_._4_4_ = 0;
      local_1c8._0_8_ = this;
      AddWarning(this,element_name_01,&proto->super_Message,NUMBER,make_error_00);
      return;
    }
    local_148 = (undefined1  [8])
                FileDescriptorTables::FindFieldByNumber
                          (this->file_tables_,*(Descriptor **)((long)local_1d0 + 0x20),
                           *(int *)((long)local_1d0 + 4));
    pDVar2 = *(Descriptor **)((long)local_1d0 + 0x20);
    if (pDVar2 == (Descriptor *)0x0) {
      local_118._8_8_ = "unknown";
      b = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x7;
    }
    else {
      local_118._8_8_ = (pDVar2->all_names_).payload_;
      b = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(ulong)*(ushort *)(local_118._8_8_ + 2);
      local_118._8_8_ = local_118._8_8_ + ~(ulong)b;
    }
    local_118._0_8_ = b;
    if ((*(undefined1 *)((long)local_1d0 + 1) & 8) == 0) {
      local_168 = absl::lts_20250127::container_internal::
                  btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                  ::EmptyNode()::empty_node;
      local_160 = (EnumDescriptor *)
                  absl::lts_20250127::container_internal::
                  btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                  ::EmptyNode()::empty_node;
      local_158 = (ServiceDescriptor *)0x0;
      local_150 = proto;
      local_120 = this;
      if (0 < pDVar2->field_count_) {
        lVar22 = 4;
        lVar26 = 0;
        do {
          local_198._M_allocated_capacity =
               (size_type)*(int *)(&pDVar2->fields_->super_SymbolBase + lVar22);
          b = &local_198;
          local_198._8_8_ = local_198._M_allocated_capacity;
          absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
          ::insert_unique<std::pair<long,long>,std::pair<long,long>>
                    ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>,_bool>
                      *)local_1c8,
                     (btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                      *)local_188[2]._M_local_buf,(pair<long,_long> *)&local_198,
                     (pair<long,_long> *)&local_198);
          lVar26 = lVar26 + 1;
          lVar22 = lVar22 + 0x58;
        } while (lVar26 < pDVar2->field_count_);
      }
      if (0 < pDVar2->extension_range_count_) {
        lVar26 = 4;
        lVar22 = 0;
        do {
          local_198._M_allocated_capacity =
               (size_type)*(int *)((long)pDVar2->extension_ranges_ + lVar26 + -4);
          local_198._8_8_ = (long)*(int *)((long)&pDVar2->extension_ranges_->start_ + lVar26) + -1;
          b = &local_198;
          absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
          ::insert_unique<std::pair<long,long>,std::pair<long,long>>
                    ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>,_bool>
                      *)local_1c8,
                     (btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                      *)local_188[2]._M_local_buf,(pair<long,_long> *)&local_198,
                     (pair<long,_long> *)&local_198);
          lVar22 = lVar22 + 1;
          lVar26 = lVar26 + 0x28;
        } while (lVar22 < pDVar2->extension_range_count_);
      }
      if (0 < pDVar2->reserved_range_count_) {
        lVar22 = 0;
        do {
          local_198._8_8_ = (long)pDVar2->reserved_ranges_[lVar22].end + -1;
          local_198._M_allocated_capacity = (size_type)pDVar2->reserved_ranges_[lVar22].start;
          b = &local_198;
          absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
          ::insert_unique<std::pair<long,long>,std::pair<long,long>>
                    ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>,_bool>
                      *)local_1c8,
                     (btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                      *)local_188[2]._M_local_buf,(pair<long,_long> *)&local_198,
                     (pair<long,_long> *)&local_198);
          lVar22 = lVar22 + 1;
        } while (lVar22 < pDVar2->reserved_range_count_);
      }
      iVar28 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                        *)(local_188 + 2));
      this_00 = local_120;
      pEVar13 = local_160;
      local_1c8._0_8_ = iVar28.node_;
      local_1c8._8_4_ = iVar28.position_;
      if (((ulong)local_160 & 7) == 0) {
        uVar1 = *(undefined1 *)((long)&(local_160->all_names_).payload_ + 2);
        lVar22 = 1;
        while (((other.position_._0_1_ = uVar1,
                other.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                               *)pEVar13, other._9_7_ = 0,
                bVar5 = absl::lts_20250127::container_internal::
                        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                        ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                                  *)local_1c8,other), !bVar5 &&
                (ppVar10 = absl::lts_20250127::container_internal::
                           btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                           ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                                        *)local_1c8), ppVar10->first <= lVar22)) &&
               (lVar26 = ppVar10->second, lVar22 <= lVar26))) {
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
          ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                       *)local_1c8);
          lVar22 = lVar26 + 1;
        }
        if (lVar22 < 0x20000000) {
          local_1c8._0_8_ =
               (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                *)0x1f;
          local_1c8._8_8_ = "Next available field number is ";
          pcVar12 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                              (lVar22,local_188[0]._M_local_buf);
          descriptor = local_150;
          local_198._M_allocated_capacity = (size_type)(pcVar12 + -(long)local_188);
          local_198._8_8_ = local_188;
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)local_140,(lts_20250127 *)local_1c8,(AlphaNum *)&local_198,
                     (AlphaNum *)b);
        }
        else {
          local_140._0_8_ = local_140 + 0x10;
          local_118._16_8_ = (DeferredValidation *)0x24;
          local_140._0_8_ =
               std::__cxx11::string::_M_create((ulong *)local_140,(ulong)(local_118 + 0x10));
          local_140._16_8_ = local_118._16_8_;
          builtin_strncpy((char *)local_140._0_8_,"There are no available field numbers",0x24);
          local_140._8_8_ = local_118._16_8_;
          *(char *)(local_140._0_8_ + local_118._16_8_) = '\0';
          descriptor = local_150;
        }
        local_1c8._0_8_ = local_1d0;
        pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
        element_name_04._M_len = (ulong)*(ushort *)(pcVar19 + 2);
        element_name_04._M_str = pcVar19 + ~element_name_04._M_len;
        local_1c8._8_8_ = local_118;
        local_1c8._16_8_ = local_148;
        local_1c8._24_8_ = local_140;
        pcStack_e8 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__9,std::__cxx11::string>
        ;
        make_error_02.invoker_._0_4_ = 0x2335bf;
        make_error_02.ptr_.obj = local_1c8;
        make_error_02.invoker_._4_4_ = 0;
        local_118._40_8_ = local_1c8;
        AddError(this_00,element_name_04,&descriptor->super_Message,NUMBER,make_error_02);
        if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
          operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
        }
        absl::lts_20250127::container_internal::
        btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
        ::~btree((btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                  *)(local_188 + 2));
        return;
      }
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<long, long>, std::less<std::pair<long, long>>, std::allocator<std::pair<long, long>>, 256, false>> *, unsigned int, unsigned char, std::pair<long, long>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<long, long>, std::less<std::pair<long, long>>, std::allocator<std::pair<long, long>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<long, long>, std::less<std::pair<long, long>>, std::allocator<std::pair<long, long>>, 256, false>> *, unsigned int, unsigned char, std::pair<long, long>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<long, long>, std::less<std::pair<long, long>>, std::allocator<std::pair<long, long>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
                   );
    }
    pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
    uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
    pcVar19 = pcVar19 + ~uVar8;
    local_1c8._0_8_ = local_1d0;
    local_e0 = local_1c8;
    local_1c8._8_8_ = local_118;
    local_1c8._16_8_ = local_148;
    pcStack_d8 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__8,std::__cxx11::string>
    ;
    uVar27._0_1_ = true;
    uVar27._1_3_ = 0x2335;
    EVar24 = NUMBER;
  }
  else {
    placeholder_type = PLACEHOLDER_ENUM;
    if ((proto->field_0)._impl_.type_ != 0xe) {
      placeholder_type = *(uint *)&proto->field_0 >> 3 & PLACEHOLDER_ENUM;
    }
    if (this->pool_->enforce_weak_ == false) {
      puVar17 = (undefined1 *)(proto->field_0)._impl_.options_;
      if ((FieldOptions *)puVar17 == (FieldOptions *)0x0) {
        puVar17 = _FieldOptions_default_instance_;
      }
      bVar23 = (((FieldOptions *)puVar17)->field_0)._impl_.weak_;
    }
    else {
      bVar23 = 0;
    }
    bVar20 = (bVar23 ^ 1) & this->pool_->lazily_build_dependencies_;
    puVar7 = (undefined8 *)
             ((ulong)(proto->field_0)._impl_.type_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
    relative_to_00._M_len = (ulong)*(ushort *)(pcVar19 + 2);
    relative_to_00._M_str = pcVar19 + ~relative_to_00._M_len;
    name_00._M_str = (char *)*puVar7;
    name_00._M_len = puVar7[1];
    local_198._M_allocated_capacity =
         (size_type)
         LookupSymbol(this,name_00,relative_to_00,placeholder_type,LOOKUP_TYPES,(bool)(bVar20 ^ 1));
    if (((SymbolBase *)local_198._M_allocated_capacity)->symbol_type_ == '\0') {
      if (bVar20 != 0) {
        if ((*(uint8_t *)((long)local_1d0 + 2) < 0xf) &&
           ((0x4c00U >> (*(uint8_t *)((long)local_1d0 + 2) & 0x1f) & 1) != 0)) {
          puVar21 = (undefined8 *)
                    ((ulong)(proto->field_0)._impl_.type_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                    );
          poVar9 = (once_flag *)
                   DescriptorPool::Tables::AllocateBytes
                             (this->tables_,
                              *(int *)(puVar21 + 1) +
                              *(int *)(((ulong)(proto->field_0)._impl_.default_value_.tagged_ptr_.
                                               ptr_ & 0xfffffffffffffffc) + 8) + 6);
          (poVar9->control_).super___atomic_base<unsigned_int>._M_i = 0;
          *(once_flag **)((long)local_1d0 + 0x18) = poVar9;
          memcpy(poVar9 + 1,(void *)*puVar21,puVar21[1] + 1);
          puVar7 = (undefined8 *)
                   ((ulong)(proto->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                   0xfffffffffffffffc);
          memcpy((void *)((long)&poVar9[1].control_.super___atomic_base<unsigned_int>._M_i +
                         puVar21[1] + 1),(void *)*puVar7,puVar7[1] + 1);
          FileDescriptorTables::AddFieldByNumber(this->file_tables_,(FieldDescriptor *)local_1d0);
          if ((*(undefined1 *)((long)local_1d0 + 1) & 8) == 0) {
            return;
          }
          DescriptorPool::Tables::AddExtension(this->tables_,(FieldDescriptor *)local_1d0);
          return;
        }
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1eb7,
                   "field->type_ == FieldDescriptor::TYPE_MESSAGE || field->type_ == FieldDescriptor::TYPE_GROUP || field->type_ == FieldDescriptor::TYPE_ENUM"
                  );
        absl::lts_20250127::log_internal::LogMessage::
        operator<<<google::protobuf::FieldDescriptorProto,_0>((LogMessage *)local_1c8,proto);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_1c8);
      }
      if ((bVar23 == 0) ||
         (name_01._M_str = "google.protobuf.Empty", name_01._M_len = 0x15,
         local_198._M_allocated_capacity = (size_type)FindSymbol(this,name_01,true),
         ((SymbolBase *)local_198._M_allocated_capacity)->symbol_type_ == '\0')) {
        pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
        uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
        pcVar19 = pcVar19 + ~uVar8;
        psVar11 = (size_type *)
                  ((ulong)(proto->field_0)._impl_.type_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
        sStack_78 = *psVar11;
        local_80._M_p = (pointer)psVar11[1];
        uVar27 = SUB84(local_80._M_p,0);
        uVar29 = (undefined4)((ulong)local_80._M_p >> 0x20);
        uVar30 = (undefined4)sStack_78;
        uVar31 = (undefined4)(sStack_78 >> 0x20);
        EVar24 = TYPE;
LAB_00223ce4:
        undefined_symbol._M_len._4_4_ = uVar29;
        undefined_symbol._M_len._0_4_ = uVar27;
        undefined_symbol._M_str._0_4_ = uVar30;
        undefined_symbol._M_str._4_4_ = uVar31;
        element_name_03._M_str = pcVar19;
        element_name_03._M_len = uVar8;
        AddNotDefinedError(this,element_name_03,&proto->super_Message,EVar24,undefined_symbol);
        return;
      }
    }
    bVar5 = Symbol::IsVisibleFrom((Symbol *)&local_198._M_allocated_capacity,this->file_);
    if (bVar5) {
      if ((undefined1  [80])((undefined1  [80])proto->field_0 & (undefined1  [80])0x400) ==
          (undefined1  [80])0x0) {
        if (*(uint8_t *)local_198._M_allocated_capacity == '\x04') {
          *(uint8_t *)((long)local_1d0 + 2) = '\x0e';
          uVar8 = 0xe;
        }
        else {
          if (*(uint8_t *)local_198._M_allocated_capacity != '\x01') {
            pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
            uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
            pcVar19 = pcVar19 + ~uVar8;
            local_a0 = (pointer)local_1c8;
            pcStack_98 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__4,std::__cxx11::string>
            ;
            pcVar4 = pcStack_98;
            pcStack_98._0_1_ = true;
            pcStack_98._1_3_ = 0x2333;
            uVar27 = pcStack_98._0_4_;
            local_1c8._0_8_ = proto;
            pcStack_98 = pcVar4;
            goto LAB_00223884;
          }
          *(uint8_t *)((long)local_1d0 + 2) = '\v';
          uVar8 = 0xb;
        }
      }
      else {
        uVar8 = (ulong)*(uint8_t *)((long)local_1d0 + 2);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + uVar8 * 4) == 8) {
        uVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
        if (*(uint8_t *)local_198._M_allocated_capacity == '\x04') {
          uVar18 = local_198._M_allocated_capacity;
        }
        ((anon_union_8_2_3066aaf9_for_type_descriptor_ *)((long)local_1d0 + 0x30))->message_type =
             (Descriptor *)uVar18;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar18 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          pEVar13 = FieldDescriptor::enum_type((FieldDescriptor *)local_1d0);
          if ((pEVar13->field_0x1 & 1) != 0) {
            *(undefined1 *)((long)local_1d0 + 1U) = *(undefined1 *)((long)local_1d0 + 1U) & 0xfe;
          }
          if ((*(undefined1 *)((long)local_1d0 + 1) & 1) == 0) {
            pEVar13 = FieldDescriptor::enum_type((FieldDescriptor *)local_1d0);
            if (0 < pEVar13->value_count_) {
              pEVar13 = FieldDescriptor::enum_type((FieldDescriptor *)local_1d0);
              pEVar16 = EnumDescriptor::value(pEVar13,0);
              ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)((long)local_1d0 + 0x50))->
              default_value_enum_ = pEVar16;
            }
            goto LAB_00223519;
          }
          bVar5 = io::Tokenizer::IsIdentifier
                            ((string *)
                             ((ulong)(proto->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                             0xfffffffffffffffc));
          if (!bVar5) {
            pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
            uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
            pcVar19 = pcVar19 + ~uVar8;
            pcVar25 = "Default value for an enum field must be an identifier.";
            goto LAB_002240fd;
          }
          puVar7 = (undefined8 *)
                   ((ulong)(proto->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                   0xfffffffffffffffc);
          pcVar19 = (char *)*puVar7;
          sVar3 = puVar7[1];
          pEVar13 = FieldDescriptor::enum_type((FieldDescriptor *)local_1d0);
          pcVar25 = (pEVar13->all_names_).payload_;
          relative_to_01._M_len = (ulong)*(ushort *)(pcVar25 + 2);
          relative_to_01._M_str = pcVar25 + ~relative_to_01._M_len;
          name_02._M_str = pcVar19;
          name_02._M_len = sVar3;
          SVar14 = LookupSymbolNoPlaceholder(this,name_02,relative_to_01,LOOKUP_ALL,true);
          if ((SVar14.ptr_)->symbol_type_ == '\x05') {
LAB_00223f66:
            pEVar13 = ((EnumValueDescriptor *)SVar14.ptr_)->type_;
            pEVar15 = FieldDescriptor::enum_type((FieldDescriptor *)local_1d0);
            if (pEVar13 == pEVar15) {
              ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)((long)local_1d0 + 0x50))->
              default_value_enum_ = (EnumValueDescriptor *)SVar14.ptr_;
              goto LAB_00223519;
            }
          }
          else if ((SVar14.ptr_)->symbol_type_ == '\x06') {
            SVar14.ptr_ = SVar14.ptr_ + -1;
            goto LAB_00223f66;
          }
          local_1c8._0_8_ = local_1d0;
          pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
          element_name_06._M_len = (ulong)*(ushort *)(pcVar19 + 2);
          element_name_06._M_str = pcVar19 + ~element_name_06._M_len;
          local_d0 = local_1c8;
          pcStack_c8 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__7,std::__cxx11::string>
          ;
          make_error_04.invoker_._0_4_ = 0x233467;
          make_error_04.ptr_.obj = (void *)local_d0;
          make_error_04.invoker_._4_4_ = 0;
          local_1c8._8_8_ = proto;
          AddError(this,element_name_06,&proto->super_Message,DEFAULT_VALUE,make_error_04);
          goto LAB_00223519;
        }
        pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
        uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
        pcVar19 = pcVar19 + ~uVar8;
        local_c0 = local_1c8;
        pcStack_b8 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__6,std::__cxx11::string>
        ;
        pcVar4 = pcStack_b8;
        pcStack_b8._0_4_ = 0x233401;
        uVar27 = pcStack_b8._0_4_;
        local_1c8._0_8_ = proto;
        pcStack_b8 = pcVar4;
      }
      else {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + uVar8 * 4) != 10) {
          pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
          uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
          pcVar19 = pcVar19 + ~uVar8;
          pcVar25 = "Field with primitive type has type_name.";
          goto LAB_00223508;
        }
        uVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
        if (*(uint8_t *)local_198._M_allocated_capacity == '\x01') {
          uVar18 = local_198._M_allocated_capacity;
        }
        ((anon_union_8_2_3066aaf9_for_type_descriptor_ *)((long)local_1d0 + 0x30))->message_type =
             (Descriptor *)uVar18;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar18 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if ((*(undefined1 *)((long)local_1d0 + 1) & 1) == 0) goto LAB_00223519;
          pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
          uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
          pcVar19 = pcVar19 + ~uVar8;
          pcVar25 = "Messages can\'t have default values.";
LAB_002240fd:
          EVar24 = DEFAULT_VALUE;
          goto LAB_00223514;
        }
        pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
        uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
        pcVar19 = pcVar19 + ~uVar8;
        local_b0 = local_1c8;
        pcStack_a8 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__5,std::__cxx11::string>
        ;
        pcVar4 = pcStack_a8;
        pcStack_a8._0_1_ = true;
        pcStack_a8._1_3_ = 0x2333;
        uVar27 = pcStack_a8._0_4_;
        local_1c8._0_8_ = proto;
        pcStack_a8 = pcVar4;
      }
    }
    else {
      pcVar19 = ((DescriptorNames *)((long)local_1d0 + 8))->payload_;
      uVar8 = (ulong)*(ushort *)(pcVar19 + 2);
      pcVar19 = pcVar19 + ~uVar8;
      local_90 = (pointer)local_1c8;
      pcStack_88 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__3,std::__cxx11::string>
      ;
      uVar27._0_1_ = true;
      uVar27._1_3_ = 0x2333;
      local_1c8._0_8_ = &local_198;
      local_1c8._8_8_ = this;
    }
LAB_00223884:
    EVar24 = TYPE;
  }
LAB_00223e44:
  make_error_03.invoker_._0_1_ = SUB41(uVar27,0);
  make_error_03.invoker_._1_3_ = SUB43(uVar27,1);
  make_error_03.ptr_.obj = local_1c8;
  make_error_03.invoker_._4_4_ = 0;
  element_name_05._M_str = pcVar19;
  element_name_05._M_len = uVar8;
  AddError(this,element_name_05,&proto->super_Message,EVar24,make_error_03);
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(FieldDescriptor* field,
                                       const FieldDescriptorProto& proto) {
  if (proto.has_extendee() && field->is_extension()) {
    Symbol extendee =
        LookupSymbol(proto.extendee(), field->full_name(),
                     DescriptorPool::PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type() != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                 return absl::StrCat("\"", proto.extendee(),
                                     "\" is not a message type.");
               });
      return;
    } else if (!extendee.IsVisibleFrom(file_)) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                 return extendee.GetVisibilityError(file_, "target of extend");
               });
      return;
    }

    field->containing_type_ = extendee.descriptor();

    const Descriptor::ExtensionRange* extension_range =
        field->containing_type()->FindExtensionRangeContainingNumber(
            field->number());

    if (extension_range == nullptr) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "\"$0\" does not declare $1 as an "
                     "extension number.",
                     field->containing_type()->full_name(), field->number());
               });
    }
  }

  if (field->containing_oneof() != nullptr) {
    if (field->label_ != FieldDescriptor::LABEL_OPTIONAL) {
      // Note that this error will never happen when parsing .proto files.
      // It can only happen if you manually construct a FileDescriptorProto
      // that is incorrect.
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    // In case of weak fields we force building the dependency. We need to know
    // if the type exist or not. If it doesn't exist we substitute Empty which
    // should only be done if the type can't be found in the generated pool.
    // TODO Ideally we should query the database directly to check
    // if weak fields exist or not so that we don't need to force building
    // weak dependencies. However the name lookup rules for symbols are
    // somewhat complicated, so I defer it too another CL.
    bool is_weak = !pool_->enforce_weak_ && proto.options().weak();
    bool is_lazy = pool_->lazily_build_dependencies_ && !is_weak;

    Symbol type =
        LookupSymbol(proto.type_name(), field->full_name(),
                     expecting_enum ? DescriptorPool::PLACEHOLDER_ENUM
                                    : DescriptorPool::PLACEHOLDER_MESSAGE,
                     LOOKUP_TYPES, !is_lazy);

    if (type.IsNull()) {
      if (is_lazy) {
        ABSL_CHECK(field->type_ == FieldDescriptor::TYPE_MESSAGE ||
                   field->type_ == FieldDescriptor::TYPE_GROUP ||
                   field->type_ == FieldDescriptor::TYPE_ENUM)
            << proto;
        // Save the symbol names for later for lookup, and allocate the once
        // object needed for the accessors.
        const std::string& name = proto.type_name();

        int name_sizes = static_cast<int>(name.size() + 1 +
                                          proto.default_value().size() + 1);

        field->type_once_ = ::new (tables_->AllocateBytes(
            static_cast<int>(sizeof(absl::once_flag)) + name_sizes))
            absl::once_flag{};
        char* names = reinterpret_cast<char*>(field->type_once_ + 1);

        memcpy(names, name.c_str(), name.size() + 1);
        memcpy(names + name.size() + 1, proto.default_value().c_str(),
               proto.default_value().size() + 1);

        // AddFieldByNumber and AddExtension are done later in this function,
        // and can/must be done if the field type was not found. The related
        // error checking is not necessary when in lazily_build_dependencies_
        // mode, and can't be done without building the type's descriptor,
        // which we don't want to do.
        file_tables_->AddFieldByNumber(field);
        if (field->is_extension()) {
          tables_->AddExtension(field);
        }
        return;
      } else {
        // If the type is a weak type, we change the type to a google.protobuf.Empty
        // field.
        if (is_weak) {
          type = FindSymbol(kNonLinkedWeakMessageReplacementName);
        }
        if (type.IsNull()) {
          AddNotDefinedError(field->full_name(), proto,
                             DescriptorPool::ErrorCollector::TYPE,
                             proto.type_name());
          return;
        }
      }
    }

    if (!type.IsVisibleFrom(file_)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               [&] { return type.GetVisibilityError(file_); });
      return;
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type() == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type() == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::StrCat("\"", proto.type_name(),
                                       "\" is not a type.");
                 });
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      field->type_descriptor_.message_type = type.descriptor();
      if (field->type_descriptor_.message_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::StrCat("\"", proto.type_name(),
                                       "\" is not a message type.");
                 });
        return;
      }

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      field->type_descriptor_.enum_type = type.enum_descriptor();
      if (field->type_descriptor_.enum_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::StrCat("\"", proto.type_name(),
                                       "\" is not an enum type.");
                 });
        return;
      }

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // Ensure that the default value is an identifier. Parser cannot always
        // verify this because it does not have complete type information.
        // N.B. that this check yields better error messages but is not
        // necessary for correctness (an enum symbol must be a valid identifier
        // anyway), only for better errors.
        if (!io::Tokenizer::IsIdentifier(proto.default_value())) {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Default value for an enum field must be an identifier.");
        } else {
          // We can't just use field->enum_type()->FindValueByName() here
          // because that locks the pool's mutex, which we have already locked
          // at this point.
          const EnumValueDescriptor* default_value =
              LookupSymbolNoPlaceholder(proto.default_value(),
                                        field->enum_type()->full_name())
                  .enum_value_descriptor();

          if (default_value != nullptr &&
              default_value->type() == field->enum_type()) {
            field->default_value_enum_ = default_value;
          } else {
            AddError(field->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE, [&] {
                       return absl::StrCat("Enum type \"",
                                           field->enum_type()->full_name(),
                                           "\" has no value named \"",
                                           proto.default_value(), "\".");
                     });
          }
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  // know their containing type until now. If we're in
  // lazily_build_dependencies_ mode, we're guaranteed there's no errors, so no
  // risk to calling containing_type() or other accessors that will build
  // dependencies.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field = file_tables_->FindFieldByNumber(
        field->containing_type(), field->number());
    const absl::string_view containing_type_name =
        field->containing_type() == nullptr
            ? absl::string_view("unknown")
            : field->containing_type()->full_name();
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "Extension number $0 has already been used "
                     "in \"$1\" by extension \"$2\".",
                     field->number(), containing_type_name,
                     conflicting_field->full_name());
               });
    } else {
      absl::btree_set<std::pair<int64_t, int64_t>> fields_used;
      auto* parent = field->containing_type();
      for (int i = 0; i < parent->field_count(); ++i) {
        int n = parent->field(i)->number();
        fields_used.insert({n, n});
      }
      for (int i = 0; i < parent->extension_range_count(); ++i) {
        auto* range = parent->extension_range(i);
        fields_used.insert({range->start_number(),
                            static_cast<int64_t>(range->end_number()) - 1});
      }
      for (int i = 0; i < parent->reserved_range_count(); ++i) {
        auto* range = parent->reserved_range(i);
        fields_used.insert(
            {range->start, static_cast<int64_t>(range->end) - 1});
      }
      int64_t proposed_number = 1;
      for (auto [start, end] : fields_used) {
        if (start <= proposed_number && proposed_number <= end) {
          proposed_number = end + 1;
        } else {
          break;
        }
      }

      const std::string proposed_message =
          proposed_number <= FieldDescriptor::kMaxNumber
              ? absl::StrCat("Next available field number is ", proposed_number)
              : "There are no available field numbers";

      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "Field number $0 has already been used in "
                     "\"$1\" by field \"$2\". $3.",
                     field->number(), containing_type_name,
                     conflicting_field->name(), proposed_message);
               });
    }
  } else {
    if (field->is_extension()) {
      if (!tables_->AddExtension(field)) {
        auto make_error = [&] {
          const FieldDescriptor* conflicting_field =
              tables_->FindExtension(field->containing_type(), field->number());
          const absl::string_view containing_type_name =
              field->containing_type() == nullptr
                  ? absl::string_view("unknown")
                  : field->containing_type()->full_name();
          return absl::Substitute(
              "Extension number $0 has already been used in \"$1\" by "
              "extension "
              "\"$2\" defined in $3.",
              field->number(), containing_type_name,
              conflicting_field->full_name(),
              conflicting_field->file()->name());
        };
        // Conflicting extension numbers should be an error. However, before
        // turning this into an error we need to fix all existing broken
        // protos first.
        // TODO: Change this to an error.
        AddWarning(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER, make_error);
      }

    }
  }
}